

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_inl.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>::CopyIterator
          (TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,
          MapIterator *this_iter,MapIterator *that_iter)

{
  CppType type;
  const_iterator *pcVar1;
  const_iterator *pcVar2;
  MapIterator *that_iter_local;
  MapIterator *this_iter_local;
  TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_local;
  
  pcVar1 = InternalGetIterator(this,that_iter);
  pcVar2 = InternalGetIterator(this,this_iter);
  (pcVar2->it_).node_ = (pcVar1->it_).node_;
  (pcVar2->it_).m_ = (pcVar1->it_).m_;
  (pcVar2->it_).bucket_index_ = (pcVar1->it_).bucket_index_;
  type = MapKey::type(&that_iter->key_);
  MapKey::SetType(&this_iter->key_,type);
  MapValueConstRef::SetType
            (&(this_iter->value_).super_MapValueConstRef,
             (that_iter->value_).super_MapValueConstRef.type_);
  (*(this->super_MapFieldBase)._vptr_MapFieldBase[0x17])(this,this_iter);
  return;
}

Assistant:

void TypeDefinedMapFieldBase<Key, T>::CopyIterator(
    MapIterator* this_iter, const MapIterator& that_iter) const {
  InternalGetIterator(this_iter) = InternalGetIterator(&that_iter);
  this_iter->key_.SetType(that_iter.key_.type());
  // MapValueRef::type() fails when containing data is null. However, if
  // this_iter points to MapEnd, data can be null.
  this_iter->value_.SetType(
      static_cast<FieldDescriptor::CppType>(that_iter.value_.type_));
  SetMapIteratorValue(this_iter);
}